

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::base_internal::anon_unknown_0::ArenaLock::ArenaLock
          (ArenaLock *this,Arena *arena)

{
  uint uVar1;
  Arena *this_00;
  int iVar2;
  uint uVar3;
  sigset_t all;
  sigset_t local_90;
  
  this->left_ = false;
  this->mask_valid_ = false;
  this->arena_ = arena;
  if ((arena->flags & 2) != 0) {
    sigfillset(&local_90);
    iVar2 = pthread_sigmask(0,&local_90,(__sigset_t *)&this->mask_);
    this->mask_valid_ = iVar2 == 0;
  }
  this_00 = this->arena_;
  uVar3 = (this_00->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar3 & 1) == 0) {
    LOCK();
    uVar1 = (this_00->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
    if (uVar3 == uVar1) {
      (this_00->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar3 | 1;
      uVar1 = uVar3;
    }
    uVar3 = uVar1;
    UNLOCK();
  }
  if ((uVar3 & 1) != 0) {
    SpinLock::SlowLock(&this_00->mu);
  }
  return;
}

Assistant:

arena_(arena) {
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
      sigset_t all;
      sigfillset(&all);
      mask_valid_ = pthread_sigmask(SIG_BLOCK, &all, &mask_) == 0;
    }
#endif
    arena_->mu.Lock();
  }